

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

int __thiscall Parse::statementList(Parse *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int unaff_EBP;
  
  bVar1 = false;
  while( true ) {
    iVar3 = this->curIndex;
    iVar2 = statement(this);
    if (iVar2 == 0) break;
    if (!bVar1) {
      unaff_EBP = 1;
    }
    bVar1 = true;
  }
  this->curIndex = iVar3;
  iVar3 = 1;
  if (bVar1) {
    iVar3 = unaff_EBP;
  }
  return iVar3;
}

Assistant:

int Parse::statementList() {
    int index = curIndex;
    if (statement()) {
        statementList();
        return 1;
    }
    curIndex = index;
    return 1;
}